

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuaternion.h
# Opt level: O2

btQuaternion __thiscall btQuaternion::inverse(btQuaternion *this)

{
  btQuaternion bVar1;
  
  bVar1.super_btQuadWord.m_floats._0_8_ =
       *(ulong *)(this->super_btQuadWord).m_floats ^ 0x8000000080000000;
  bVar1.super_btQuadWord.m_floats._8_8_ =
       *(ulong *)((this->super_btQuadWord).m_floats + 2) ^ 0x80000000;
  return (btQuaternion)bVar1.super_btQuadWord.m_floats;
}

Assistant:

btQuaternion inverse() const
	{
#if defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		return btQuaternion(_mm_xor_ps(mVec128, vQInv));
#elif defined(BT_USE_NEON)
        return btQuaternion((btSimdFloat4)veorq_s32((int32x4_t)mVec128, (int32x4_t)vQInv));
#else	
		return btQuaternion(-m_floats[0], -m_floats[1], -m_floats[2], m_floats[3]);
#endif
	}